

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

String * asl::Url::params(String *__return_storage_ptr__,Dic<asl::String> *q)

{
  String *pSVar1;
  long lVar2;
  KeyVal *pKVar3;
  anon_union_16_2_78e7fdac_for_String_2 *b;
  long lVar4;
  Dic<asl::String> d;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> local_70;
  String local_68;
  String local_50;
  String *local_38;
  
  local_38 = __return_storage_ptr__;
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc(&local_70,0);
  pKVar3 = (q->super_Map<asl::String,_asl::String>).a._a;
  if (0 < *(int *)&pKVar3[-1].value.field_2) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      encode(&local_68,(String *)((long)&(pKVar3->value)._size + lVar2),true);
      encode(&local_50,(String *)((long)&(pKVar3->key)._size + lVar2),true);
      pSVar1 = Map<asl::String,_asl::String>::operator[]
                         ((Map<asl::String,_asl::String> *)&local_70,&local_50);
      b = &local_68.field_2;
      if (local_68._size != 0) {
        b = (anon_union_16_2_78e7fdac_for_String_2 *)
            CONCAT62(local_68.field_2._2_6_,local_68.field_2._0_2_);
      }
      String::assign(pSVar1,b->_space,local_68._len);
      if (local_50._size != 0) {
        free((void *)CONCAT62(local_50.field_2._2_6_,local_50.field_2._0_2_));
      }
      if (local_68._size != 0) {
        free((void *)CONCAT62(local_68.field_2._2_6_,local_68.field_2._0_2_));
      }
      pKVar3 = (q->super_Map<asl::String,_asl::String>).a._a;
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar4 < *(int *)&pKVar3[-1].value.field_2);
  }
  pSVar1 = local_38;
  local_68._size = 0;
  local_68._len = 1;
  local_68.field_2._0_2_ = 0x26;
  local_50._size = 0;
  local_50._len = 1;
  local_50.field_2._0_2_ = 0x3d;
  Map<asl::String,_asl::String>::join
            (local_38,(Map<asl::String,_asl::String> *)&local_70,&local_68,&local_50);
  if (local_50._size != 0) {
    free((void *)CONCAT62(local_50.field_2._2_6_,local_50.field_2._0_2_));
  }
  if (local_68._size != 0) {
    free((void *)CONCAT62(local_68.field_2._2_6_,local_68.field_2._0_2_));
  }
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array(&local_70);
  return pSVar1;
}

Assistant:

String Url::params(const Dic<>& q)
{
	Dic<> d;
	foreach2(String& k, const String& v, q)
		d[Url::encode(k, true)] = Url::encode(v, true);
	return d.join('&', '=');
}